

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O1

wchar_t archive_write_mtree_finish_entry(archive_write *a)

{
  uint uVar1;
  long *plVar2;
  long lVar3;
  undefined4 *puVar4;
  bool bVar5;
  uint uVar6;
  ulong uVar7;
  
  plVar2 = (long *)a->format_data;
  lVar3 = *plVar2;
  if (lVar3 != 0) {
    *plVar2 = 0;
    puVar4 = *(undefined4 **)(lVar3 + 0x30);
    if (puVar4 != (undefined4 *)0x0) {
      uVar1 = *(uint *)(plVar2 + 0x1c);
      if ((uVar1 & 1) != 0) {
        if (plVar2[0x1d] != 0) {
          uVar6 = *(uint *)((long)plVar2 + 0xe4);
          uVar7 = plVar2[0x1d];
          do {
            uVar6 = uVar6 << 8 ^ crctab[(uint)uVar7 & 0xff ^ uVar6 >> 0x18];
            bVar5 = 0xff < uVar7;
            uVar7 = uVar7 >> 8;
          } while (bVar5);
          *(uint *)((long)plVar2 + 0xe4) = uVar6;
        }
        puVar4[1] = ~*(uint *)((long)plVar2 + 0xe4);
      }
      if ((uVar1 >> 8 & 1) != 0) {
        __archive_md5final((archive_md5_ctx *)(plVar2 + 0x1e),puVar4 + 2);
      }
      if ((*(byte *)((long)plVar2 + 0xe1) & 0x20) != 0) {
        __archive_ripemd160final((archive_rmd160_ctx *)(plVar2 + 0x1f),puVar4 + 6);
      }
      if ((*(byte *)((long)plVar2 + 0xe1) & 0x40) != 0) {
        __archive_sha1final((archive_sha1_ctx *)(plVar2 + 0x20),puVar4 + 0xb);
      }
      if ((*(byte *)((long)plVar2 + 0xe2) & 0x80) != 0) {
        __archive_sha256final((archive_sha256_ctx *)(plVar2 + 0x21),puVar4 + 0x10);
      }
      if ((*(byte *)((long)plVar2 + 0xe3) & 1) != 0) {
        __archive_sha384final((archive_sha384_ctx *)(plVar2 + 0x22),puVar4 + 0x18);
      }
      if ((*(byte *)((long)plVar2 + 0xe3) & 2) != 0) {
        __archive_sha512final((archive_sha512_ctx *)(plVar2 + 0x23),puVar4 + 0x24);
      }
      *puVar4 = (int)plVar2[0x1c];
    }
  }
  return L'\0';
}

Assistant:

static int
archive_write_mtree_finish_entry(struct archive_write *a)
{
	struct mtree_writer *mtree = a->format_data;
	struct mtree_entry *me;

	if ((me = mtree->mtree_entry) == NULL)
		return (ARCHIVE_OK);
	mtree->mtree_entry = NULL;

	if (me->reg_info)
		sum_final(mtree, me->reg_info);

	return (ARCHIVE_OK);
}